

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O3

Node __thiscall Jzon::Node::get(Node *this,string *name)

{
  pointer pcVar1;
  undefined8 *puVar2;
  void *__s2;
  size_t __n;
  Data *pDVar3;
  int iVar4;
  undefined8 *in_RDX;
  undefined8 *puVar5;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  if ((pcVar1 != (pointer)0x0) && (*(int *)(pcVar1 + 4) == 1)) {
    puVar5 = *(undefined8 **)(pcVar1 + 0x28);
    puVar2 = *(undefined8 **)(pcVar1 + 0x30);
    if (puVar5 != puVar2) {
      __s2 = (void *)*in_RDX;
      __n = in_RDX[1];
      do {
        if ((puVar5[1] == __n) &&
           ((__n == 0 || (iVar4 = bcmp((void *)*puVar5,__s2,__n), iVar4 == 0)))) {
          pDVar3 = (Data *)puVar5[4];
          this->data = pDVar3;
          if (pDVar3 == (Data *)0x0) {
            return (Node)(Data *)this;
          }
          pDVar3->refCount = pDVar3->refCount + 1;
          return (Node)(Data *)this;
        }
        puVar5 = puVar5 + 5;
      } while (puVar5 != puVar2);
    }
  }
  this->data = (Data *)0x0;
  return (Node)(Data *)this;
}

Assistant:

Node Node::get(const std::string &name) const
	{
		if (isObject())
		{
			NamedNodeList &children = data->children;
			for (NamedNodeList::const_iterator it = children.begin(); it != children.end(); ++it)
			{
				if ((*it).first == name)
				{
					return (*it).second;
				}
			}
		}
		return Node(T_INVALID);
	}